

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svectorbase.h
# Opt level: O0

SVectorBase<double> * __thiscall
soplex::SVectorBase<double>::operator=(SVectorBase<double> *this,SVectorBase<double> *sv)

{
  SVectorBase<double> *in_RSI;
  SVectorBase<double> *in_RDI;
  Nonzero<double> *s;
  Nonzero<double> *e;
  int nnz;
  int i;
  Nonzero<double> *local_28;
  Nonzero<double> *local_20;
  int local_18;
  int local_14;
  
  if (in_RDI != in_RSI) {
    local_14 = size(in_RSI);
    local_18 = 0;
    local_20 = in_RDI->m_elem;
    local_28 = in_RSI->m_elem;
    while (local_14 != 0) {
      if ((local_28->val != 0.0) || (NAN(local_28->val))) {
        local_20->val = local_28->val;
        local_20->idx = local_28->idx;
        local_18 = local_18 + 1;
        local_20 = local_20 + 1;
      }
      local_28 = local_28 + 1;
      local_14 = local_14 + -1;
    }
    set_size(in_RDI,local_18);
  }
  return in_RDI;
}

Assistant:

SVectorBase<R>& operator=(const SVectorBase<R>& sv)
   {
      if(this != &sv)
      {
         assert(max() >= sv.size());

         int i = sv.size();
         int nnz = 0;
         Nonzero<R>* e = m_elem;
         const Nonzero<R>* s = sv.m_elem;

         while(i--)
         {
            assert(e != nullptr);

            if(s->val != 0.0)
            {
               *e++ = *s;
               ++nnz;
            }

            ++s;
         }

         set_size(nnz);
      }

      return *this;
   }